

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coro_http_client.hpp
# Opt level: O0

int __thiscall
cinatra::coro_http_client::connect(coro_http_client *this,int __fd,sockaddr *__addr,socklen_t __len)

{
  bool bVar1;
  int iVar2;
  undefined8 *puVar3;
  element_type *peVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  socklen_t sVar5;
  coro_http_client *pcVar6;
  error_code *this_00;
  coro_http_client *this_01;
  error_code *this_02;
  coro_http_client *this_03;
  coro_http_client *this_04;
  sockaddr *psVar7;
  undefined8 uVar8;
  sockaddr *__addr_00;
  sockaddr *__addr_01;
  sockaddr *__addr_02;
  sockaddr *__addr_03;
  undefined4 in_register_00000034;
  error_code eVar9;
  error_code eVar10;
  error_code ec_1;
  error_code ec;
  undefined7 in_stack_fffffffffffffb38;
  undefined1 in_stack_fffffffffffffb3f;
  undefined4 in_stack_fffffffffffffb40;
  undefined4 in_stack_fffffffffffffb44;
  undefined4 in_stack_fffffffffffffb48;
  undefined4 in_stack_fffffffffffffb4c;
  undefined4 in_stack_fffffffffffffb58;
  undefined4 in_stack_fffffffffffffb5c;
  undefined4 in_stack_fffffffffffffb60;
  undefined4 in_stack_fffffffffffffb64;
  uri_t *in_stack_fffffffffffffb68;
  undefined4 in_stack_fffffffffffffb78;
  undefined4 in_stack_fffffffffffffb7c;
  int iVar11;
  undefined4 in_stack_fffffffffffffb80;
  undefined4 in_stack_fffffffffffffb84;
  undefined4 in_stack_fffffffffffffba8;
  undefined4 in_stack_fffffffffffffbac;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffbb0;
  int local_440;
  uri_t *in_stack_fffffffffffffbd8;
  int local_408;
  basic_string_view<char,_std::char_traits<char>_> abStack_2a8 [2];
  undefined8 local_288;
  undefined8 local_280;
  undefined8 local_278;
  undefined4 local_270;
  undefined1 local_26c;
  basic_string_view<char,_std::char_traits<char>_> abStack_268 [2];
  undefined8 local_248;
  undefined4 local_210;
  undefined1 local_20c;
  basic_string_view<char,_std::char_traits<char>_> abStack_208 [2];
  undefined8 local_1e8;
  socklen_t local_1e0;
  error_category *local_1d8;
  string *in_stack_fffffffffffffe30;
  string *in_stack_fffffffffffffe38;
  error_category *in_stack_fffffffffffffe40;
  ExecutorWrapper<asio::io_context::basic_executor_type<std::allocator<void>,_0UL>_>
  *in_stack_fffffffffffffe48;
  basic_string_view<char,_std::char_traits<char>_> abStack_1a0 [2];
  undefined8 local_180;
  int local_178;
  error_category *local_170;
  undefined8 local_168;
  undefined8 local_160;
  undefined4 local_158;
  undefined1 local_154;
  basic_string_view<char,_std::char_traits<char>_> abStack_150 [2];
  undefined8 local_130;
  sockaddr *local_48;
  undefined8 local_40;
  coro_http_client *local_38;
  
  local_48 = __addr;
  local_40 = CONCAT44(in_register_00000034,__fd);
  local_38 = this;
  puVar3 = (undefined8 *)operator_new(0x100,(nothrow_t *)&std::nothrow);
  if (puVar3 == (undefined8 *)0x0) {
    async_simple::coro::detail::LazyPromise<cinatra::resp_data>::
    get_return_object_on_allocation_failure();
    goto LAB_001606a9;
  }
  *puVar3 = connect;
  puVar3[1] = connect;
  pcVar6 = (coro_http_client *)((long)puVar3 + 0xfd);
  this_00 = (error_code *)(puVar3 + 0x12);
  this_01 = (coro_http_client *)(puVar3 + 0x1a);
  this_02 = (error_code *)(puVar3 + 0x14);
  this_03 = (coro_http_client *)(puVar3 + 0x1c);
  this_04 = (coro_http_client *)((long)puVar3 + 0xfe);
  puVar3[0x1e] = CONCAT44(in_register_00000034,__fd);
  puVar3[0x18] = local_48;
  psVar7 = local_48;
  async_simple::coro::detail::LazyPromise<cinatra::resp_data>::LazyPromise
            ((LazyPromise<cinatra::resp_data> *)
             CONCAT44(in_stack_fffffffffffffb44,in_stack_fffffffffffffb40));
  sVar5 = (socklen_t)psVar7;
  async_simple::coro::detail::LazyPromise<cinatra::resp_data>::get_return_object
            ((LazyPromise<cinatra::resp_data> *)
             CONCAT44(in_stack_fffffffffffffb5c,in_stack_fffffffffffffb58));
  async_simple::coro::detail::LazyPromiseBase::initial_suspend((LazyPromiseBase *)(puVar3 + 2));
  bVar1 = std::suspend_always::await_ready((suspend_always *)pcVar6);
  iVar2 = (int)puVar3;
  if (!bVar1) {
    *(undefined1 *)((long)puVar3 + 0xfc) = 0;
    connect(pcVar6,iVar2,__addr_00,sVar5);
    goto LAB_001606a9;
  }
  std::suspend_always::await_resume((suspend_always *)pcVar6);
  std::
  __shared_ptr_access<cinatra::coro_http_client::socket_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  ::operator->((__shared_ptr_access<cinatra::coro_http_client::socket_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)0x15fa17);
  bVar1 = std::atomic::operator_cast_to_bool
                    ((atomic<bool> *)CONCAT44(in_stack_fffffffffffffb4c,in_stack_fffffffffffffb48));
  if (!bVar1) {
LAB_00160538:
    std::error_code::error_code
              ((error_code *)CONCAT44(in_stack_fffffffffffffb44,in_stack_fffffffffffffb40));
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(abStack_2a8);
    std::span<cinatra::http_header,_18446744073709551615UL>::span
              ((span<cinatra::http_header,_18446744073709551615UL> *)0x16057a);
    local_288 = 0;
    async_simple::coro::detail::LazyPromise<cinatra::resp_data>::return_value<cinatra::resp_data>
              ((LazyPromise<cinatra::resp_data> *)
               CONCAT44(in_stack_fffffffffffffb44,in_stack_fffffffffffffb40),
               (resp_data *)CONCAT17(in_stack_fffffffffffffb3f,in_stack_fffffffffffffb38));
    goto LAB_00160438;
  }
  peVar4 = std::
           __shared_ptr_access<cinatra::coro_http_client::socket_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<cinatra::coro_http_client::socket_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x15fa4f);
  peVar4->is_timeout_ = false;
  bVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x15fa67);
  if (bVar1) {
    uri_t::get_host_abi_cxx11_(in_stack_fffffffffffffb68);
  }
  else {
    std::__cxx11::string::string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffffb84,in_stack_fffffffffffffb80),
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffffb7c,in_stack_fffffffffffffb78));
  }
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (in_stack_fffffffffffffbb0,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_fffffffffffffbac,in_stack_fffffffffffffba8));
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_fffffffffffffb44,in_stack_fffffffffffffb40));
  bVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x15fafc);
  if (bVar1) {
    uri_t::get_port_abi_cxx11_(in_stack_fffffffffffffbd8);
  }
  else {
    std::__cxx11::string::string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffffb84,in_stack_fffffffffffffb80),
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffffb7c,in_stack_fffffffffffffb78));
  }
  uVar8 = puVar3[0x1e];
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (in_stack_fffffffffffffbb0,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_fffffffffffffbac,in_stack_fffffffffffffba8));
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_fffffffffffffb44,in_stack_fffffffffffffb40));
  std::
  __shared_ptr_access<cinatra::coro_http_client::socket_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  ::operator->((__shared_ptr_access<cinatra::coro_http_client::socket_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)0x15fbb2);
  sVar5 = (int)uVar8 + 0xf68;
  coro_io::
  async_connect<coro_io::ExecutorWrapper<asio::io_context::basic_executor_type<std::allocator<void>,0ul>>>
            (in_stack_fffffffffffffe48,(socket *)in_stack_fffffffffffffe40,in_stack_fffffffffffffe38
             ,in_stack_fffffffffffffe30);
  async_simple::coro::detail::LazyPromiseBase::
  await_transform<async_simple::coro::Lazy<std::error_code>>
            ((LazyPromiseBase *)CONCAT44(in_stack_fffffffffffffb4c,in_stack_fffffffffffffb48),
             (Lazy<std::error_code> *)CONCAT44(in_stack_fffffffffffffb44,in_stack_fffffffffffffb40))
  ;
  bVar1 = async_simple::coro::detail::LazyAwaiterBase<std::error_code>::await_ready
                    ((LazyAwaiterBase<std::error_code> *)this_01);
  if (!bVar1) {
    *(undefined1 *)((long)puVar3 + 0xfc) = 1;
    iVar2 = connect(this_01,iVar2,__addr_01,sVar5);
    (**(code **)CONCAT44(extraout_var,iVar2))((undefined8 *)CONCAT44(extraout_var,iVar2));
    goto LAB_001606a9;
  }
  puVar3[0x16] = this_01;
  eVar9 = async_simple::coro::detail::LazyAwaiterBase<std::error_code>::awaitResume
                    ((LazyAwaiterBase<std::error_code> *)
                     CONCAT44(in_stack_fffffffffffffb5c,in_stack_fffffffffffffb58));
  pcVar6 = (coro_http_client *)eVar9._M_cat;
  *(int *)(puVar3 + 0xe) = eVar9._M_value;
  puVar3[0xf] = pcVar6;
  uVar8 = puVar3[0xf];
  this_00->_M_value = *(int *)(puVar3 + 0xe);
  puVar3[0x13] = uVar8;
  async_simple::coro::detail::LazyBase<std::error_code,_false>::ValueAwaiter::~ValueAwaiter
            ((ValueAwaiter *)0x15fdc7);
  sVar5 = (socklen_t)uVar8;
  async_simple::coro::Lazy<std::error_code>::~Lazy((Lazy<std::error_code> *)0x15fdd4);
  bVar1 = std::error_code::operator_cast_to_bool(this_00);
  if (bVar1) {
    uVar8 = *(undefined8 *)this_00;
    local_160 = puVar3[0x13];
    local_158 = 0x194;
    local_154 = 0;
    local_168 = uVar8;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(abStack_150);
    sVar5 = (socklen_t)uVar8;
    std::span<cinatra::http_header,_18446744073709551615UL>::span
              ((span<cinatra::http_header,_18446744073709551615UL> *)0x15fe64);
    local_130 = 0;
    async_simple::coro::detail::LazyPromise<cinatra::resp_data>::return_value<cinatra::resp_data>
              ((LazyPromise<cinatra::resp_data> *)
               CONCAT44(in_stack_fffffffffffffb44,in_stack_fffffffffffffb40),
               (resp_data *)CONCAT17(in_stack_fffffffffffffb3f,in_stack_fffffffffffffb38));
    local_408 = 3;
  }
  else {
    local_408 = 0;
  }
  if (local_408 == 0) {
    peVar4 = std::
             __shared_ptr_access<cinatra::coro_http_client::socket_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<cinatra::coro_http_client::socket_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x15ff29);
    if ((peVar4->is_timeout_ & 1U) == 0) {
      if ((*(byte *)(puVar3[0x1e] + 0xfe0) & 1) != 0) {
        std::error_code::error_code
                  ((error_code *)CONCAT44(in_stack_fffffffffffffb44,in_stack_fffffffffffffb40));
        std::
        __shared_ptr_access<cinatra::coro_http_client::socket_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
        ::operator->((__shared_ptr_access<cinatra::coro_http_client::socket_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)0x16001b);
        asio::detail::socket_option::boolean<6,_1>::boolean
                  ((boolean<6,_1> *)&stack0xfffffffffffffe34,true);
        eVar10 = asio::basic_socket<asio::ip::tcp,asio::any_io_executor>::
                 set_option<asio::detail::socket_option::boolean<6,1>>
                           ((basic_socket<asio::ip::tcp,_asio::any_io_executor> *)
                            in_stack_fffffffffffffb68,
                            (boolean<6,_1> *)
                            CONCAT44(in_stack_fffffffffffffb64,in_stack_fffffffffffffb60),
                            (error_code *)
                            CONCAT44(in_stack_fffffffffffffb5c,in_stack_fffffffffffffb58));
        local_1d8 = eVar10._M_cat;
        local_1e0 = eVar10._M_value;
        sVar5 = local_1e0;
        bVar1 = std::error_code::operator_cast_to_bool((error_code *)&stack0xfffffffffffffe38);
        if (bVar1) {
          local_210 = 0x194;
          local_20c = 0;
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(abStack_208);
          std::span<cinatra::http_header,_18446744073709551615UL>::span
                    ((span<cinatra::http_header,_18446744073709551615UL> *)0x1600ec);
          local_1e8 = 0;
          async_simple::coro::detail::LazyPromise<cinatra::resp_data>::
          return_value<cinatra::resp_data>
                    ((LazyPromise<cinatra::resp_data> *)
                     CONCAT44(in_stack_fffffffffffffb44,in_stack_fffffffffffffb40),
                     (resp_data *)CONCAT17(in_stack_fffffffffffffb3f,in_stack_fffffffffffffb38));
          local_440 = 3;
        }
        else {
          local_440 = 0;
        }
        if (local_440 != 0) goto LAB_00160438;
      }
      if ((*(byte *)(puVar3[0x18] + 0x70) & 1) != 0) {
        handle_shake(pcVar6);
        async_simple::coro::detail::LazyPromiseBase::
        await_transform<async_simple::coro::Lazy<std::error_code>>
                  ((LazyPromiseBase *)CONCAT44(in_stack_fffffffffffffb4c,in_stack_fffffffffffffb48),
                   (Lazy<std::error_code> *)
                   CONCAT44(in_stack_fffffffffffffb44,in_stack_fffffffffffffb40));
        bVar1 = async_simple::coro::detail::LazyAwaiterBase<std::error_code>::await_ready
                          ((LazyAwaiterBase<std::error_code> *)this_03);
        if (!bVar1) {
          *(undefined1 *)((long)puVar3 + 0xfc) = 2;
          iVar2 = connect(this_03,iVar2,__addr_02,sVar5);
          (**(code **)CONCAT44(extraout_var_00,iVar2))
                    ((undefined8 *)CONCAT44(extraout_var_00,iVar2));
          goto LAB_001606a9;
        }
        puVar3[0x17] = this_03;
        eVar9 = async_simple::coro::detail::LazyAwaiterBase<std::error_code>::awaitResume
                          ((LazyAwaiterBase<std::error_code> *)
                           CONCAT44(in_stack_fffffffffffffb5c,in_stack_fffffffffffffb58));
        *(int *)(puVar3 + 0x10) = eVar9._M_value;
        puVar3[0x11] = eVar9._M_cat;
        uVar8 = puVar3[0x11];
        this_02->_M_value = *(int *)(puVar3 + 0x10);
        puVar3[0x15] = uVar8;
        sVar5 = (socklen_t)uVar8;
        iVar11 = 0;
        async_simple::coro::detail::LazyBase<std::error_code,_false>::ValueAwaiter::~ValueAwaiter
                  ((ValueAwaiter *)0x160339);
        async_simple::coro::Lazy<std::error_code>::~Lazy((Lazy<std::error_code> *)0x160346);
        if (iVar11 == 0) {
          bVar1 = std::error_code::operator_cast_to_bool(this_02);
          if (bVar1) {
            uVar8 = *(undefined8 *)this_02;
            local_278 = puVar3[0x15];
            local_270 = 0x194;
            local_26c = 0;
            local_280 = uVar8;
            std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(abStack_268);
            sVar5 = (socklen_t)uVar8;
            std::span<cinatra::http_header,_18446744073709551615UL>::span
                      ((span<cinatra::http_header,_18446744073709551615UL> *)0x1603ca);
            local_248 = 0;
            async_simple::coro::detail::LazyPromise<cinatra::resp_data>::
            return_value<cinatra::resp_data>
                      ((LazyPromise<cinatra::resp_data> *)
                       CONCAT44(in_stack_fffffffffffffb44,in_stack_fffffffffffffb40),
                       (resp_data *)CONCAT17(in_stack_fffffffffffffb3f,in_stack_fffffffffffffb38));
            iVar11 = 3;
          }
          else {
            iVar11 = 0;
          }
        }
        if (iVar11 != 0) {
          sVar5 = iVar11 - 3;
          if (sVar5 != 0) goto LAB_00160628;
          goto LAB_00160438;
        }
      }
      std::
      __shared_ptr_access<cinatra::coro_http_client::socket_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
      ::operator->((__shared_ptr_access<cinatra::coro_http_client::socket_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x16052a);
      std::atomic<bool>::operator=
                ((atomic<bool> *)CONCAT44(in_stack_fffffffffffffb44,in_stack_fffffffffffffb40),
                 (bool)in_stack_fffffffffffffb3f);
      goto LAB_00160538;
    }
    eVar9 = std::make_error_code(0);
    local_170 = eVar9._M_cat;
    local_178 = eVar9._M_value;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(abStack_1a0);
    std::span<cinatra::http_header,_18446744073709551615UL>::span
              ((span<cinatra::http_header,_18446744073709551615UL> *)0x15ffa1);
    local_180 = 0;
    async_simple::coro::detail::LazyPromise<cinatra::resp_data>::return_value<cinatra::resp_data>
              ((LazyPromise<cinatra::resp_data> *)
               CONCAT44(in_stack_fffffffffffffb44,in_stack_fffffffffffffb40),
               (resp_data *)CONCAT17(in_stack_fffffffffffffb3f,in_stack_fffffffffffffb38));
LAB_00160438:
    async_simple::coro::detail::LazyPromiseBase::final_suspend((LazyPromiseBase *)(puVar3 + 2));
    bVar1 = async_simple::coro::detail::LazyPromiseBase::FinalAwaiter::await_ready
                      ((FinalAwaiter *)this_04);
    if (!bVar1) {
      *puVar3 = 0;
      *(undefined1 *)((long)puVar3 + 0xfc) = 3;
      iVar2 = connect(this_04,iVar2,__addr_03,sVar5);
      (**(code **)CONCAT44(extraout_var_01,iVar2))((undefined8 *)CONCAT44(extraout_var_01,iVar2));
      goto LAB_001606a9;
    }
    async_simple::coro::detail::LazyPromiseBase::FinalAwaiter::await_resume((FinalAwaiter *)this_04)
    ;
  }
  else {
    sVar5 = local_408 - 3;
    if (sVar5 == 0) goto LAB_00160438;
  }
LAB_00160628:
  async_simple::coro::detail::LazyPromise<cinatra::resp_data>::~LazyPromise
            ((LazyPromise<cinatra::resp_data> *)0x160640);
  if (puVar3 != (undefined8 *)0x0) {
    operator_delete(puVar3,0x100);
  }
LAB_001606a9:
  return (int)this;
}

Assistant:

async_simple::coro::Lazy<resp_data> connect(const uri_t &u) {
    if (socket_->has_closed_) {
      socket_->is_timeout_ = false;
      host_ = proxy_host_.empty() ? u.get_host() : proxy_host_;
      port_ = proxy_port_.empty() ? u.get_port() : proxy_port_;
      if (auto ec = co_await coro_io::async_connect(
              &executor_wrapper_, socket_->impl_, host_, port_);
          ec) {
        co_return resp_data{ec, 404};
      }

#ifdef INJECT_FOR_HTTP_CLIENT_TEST
      if (connect_timeout_forever_) {
        socket_->is_timeout_ = true;
      }
#endif
      if (socket_->is_timeout_) {
        auto ec = std::make_error_code(std::errc::timed_out);
        co_return resp_data{ec, 404};
      }

      if (enable_tcp_no_delay_) {
        std::error_code ec;
        socket_->impl_.set_option(asio::ip::tcp::no_delay(true), ec);
        if (ec) {
          co_return resp_data{ec, 404};
        }
      }

      if (u.is_ssl) {
#ifdef CINATRA_ENABLE_SSL
        if (!has_init_ssl_) {
          size_t pos = u.host.find("www.");
          std::string host;
          if (pos != std::string_view::npos) {
            host = std::string{u.host.substr(pos + 4)};
          }
          else {
            host = std::string{u.host};
          }
          bool r = init_ssl(asio::ssl::verify_none, "", host);
          if (!r) {
            co_return resp_data{
                std::make_error_code(std::errc::invalid_argument), 404};
          }
        }
#endif
        if (auto ec = co_await handle_shake(); ec) {
          co_return resp_data{ec, 404};
        }
      }
      socket_->has_closed_ = false;
    }

    co_return resp_data{};
  }